

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O1

void chrono::turtlebot::AddRevoluteJoint
               (shared_ptr<chrono::ChBodyAuxRef> *body_1,shared_ptr<chrono::ChBodyAuxRef> *body_2,
               shared_ptr<chrono::ChBodyAuxRef> *chassis,ChSystem *system,
               ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot)

{
  ChFrame<double> *this;
  ChLinkLockRevolute *this_00;
  shared_ptr<chrono::ChLinkLockRevolute> revo;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  ChLinkLockRevolute *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  ChLinkLockRevolute *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  ChFrame<double> local_178;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  ChFrame<double> local_b8;
  
  this = (ChFrame<double> *)
         (**(code **)(*(long *)(chassis->
                               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + 0x1f0))();
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_b8.coord.pos.m_data[0] = rel_joint_pos->m_data[0];
  local_b8.coord.pos.m_data[1] = rel_joint_pos->m_data[1];
  local_b8.coord.pos.m_data[2] = rel_joint_pos->m_data[2];
  local_b8.coord.rot.m_data[0] = rel_joint_rot->m_data[0];
  local_b8.coord.rot.m_data[1] = rel_joint_rot->m_data[1];
  local_b8.coord.rot.m_data[2] = rel_joint_rot->m_data[2];
  local_b8.coord.rot.m_data[3] = rel_joint_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,rel_joint_rot);
  ChFrame<double>::operator*(&local_178,this,&local_b8);
  this_00 = (ChLinkLockRevolute *)ChLinkLock::operator_new((ChLinkLock *)0xe90,(size_t)this);
  ChLinkLockRevolute::ChLinkLockRevolute(this_00);
  local_188 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockRevolute*>
            (&local_180,this_00);
  local_198 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_190 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_190->_M_use_count = local_190->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_190->_M_use_count = local_190->_M_use_count + 1;
    }
  }
  local_1a8 = (body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a0 = (body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
    }
  }
  local_f0 = local_178.coord.pos.m_data[0];
  local_e8 = local_178.coord.pos.m_data[1];
  dStack_e0 = local_178.coord.pos.m_data[2];
  local_d8 = local_178.coord.rot.m_data[0];
  dStack_d0 = local_178.coord.rot.m_data[1];
  dStack_c8 = local_178.coord.rot.m_data[2];
  dStack_c0 = local_178.coord.rot.m_data[3];
  (**(code **)(*(long *)local_188 + 0x250))(local_188,&local_198,&local_1a8);
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
  }
  local_1b8 = local_188;
  local_1b0 = local_180._M_pi;
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)system + 0x138))(system,&local_1b8);
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
  }
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  return;
}

Assistant:

void AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                      std::shared_ptr<ChBodyAuxRef> body_2,
                      std::shared_ptr<ChBodyAuxRef> chassis,
                      ChSystem* system,
                      const ChVector<>& rel_joint_pos,
                      const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto revo = chrono_types::make_shared<ChLinkLockRevolute>();
    revo->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(revo);
}